

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  DebugFilters *pDVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  string file;
  string report;
  DebugFilters filters;
  MemoryMappedFile exeFile;
  DebugInfo info;
  undefined1 local_228 [32];
  string local_208;
  DebugFilters local_1e8;
  long *local_1b0;
  ulong local_1a8;
  long local_1a0 [2];
  long *local_190;
  ulong local_188;
  long local_180 [2];
  MemoryMappedFile local_170;
  long *local_158;
  ulong local_150;
  long local_148 [2];
  DebugInfo local_138;
  
  local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
  local_1e8.name._M_string_length = 0;
  local_1e8.name.field_2._M_local_buf[0] = '\0';
  local_1e8.minFunction = 0x200;
  local_1e8.minData = 0x400;
  local_1e8.minClass = 0x800;
  local_1e8.minFile = 0x800;
  local_1e8.minTemplate = 0x200;
  local_1e8.minTemplateCount = 3;
  local_228._0_8_ = local_228 + 0x10;
  local_228._8_8_ = 0;
  local_228[0x10] = '\0';
  parg_init((parg_state *)&local_138);
  do {
    while (iVar8 = parg_getopt_long((parg_state *)&local_138,argc,argv,"an:m:f:d:c:F:t:T:h",
                                    (parg_option *)
                                    parse_cmdline(int,char_const**,DebugFilters&,std::__cxx11::string&)
                                    ::argsTable,(int *)0x0),
          pSVar6 = local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start, 0x53 < iVar8) {
      switch(iVar8) {
      case 0x61:
        local_1e8.minFunction = 0;
        local_1e8.minData = 0;
        local_1e8.minClass = 0;
        local_1e8.minFile = 0;
        local_1e8.minTemplate = 0;
        break;
      case 0x62:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
        goto switchD_0010990e_caseD_62;
      case 99:
        dVar13 = atof((char *)local_138.m_Symbols.
                              super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_1e8.minClass = (int)(dVar13 * 1024.0);
        break;
      case 100:
        dVar13 = atof((char *)local_138.m_Symbols.
                              super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_1e8.minData = (int)(dVar13 * 1024.0);
        break;
      case 0x66:
        dVar13 = atof((char *)local_138.m_Symbols.
                              super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_1e8.minFunction = (int)(dVar13 * 1024.0);
        break;
      case 0x6d:
        dVar13 = atof((char *)local_138.m_Symbols.
                              super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_1e8.minTemplate = (int)(dVar13 * 1024.0);
        local_1e8.minClass = local_1e8.minTemplate;
        local_1e8.minFile = local_1e8.minTemplate;
        local_1e8.minFunction = local_1e8.minTemplate;
        local_1e8.minData = local_1e8.minTemplate;
        break;
      case 0x6e:
        pDVar10 = &local_1e8;
LAB_0010999c:
        pcVar2 = (char *)(pDVar10->name)._M_string_length;
        strlen((char *)local_138.m_Symbols.
                       super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                       super__Vector_impl_data._M_start);
        std::__cxx11::string::_M_replace((ulong)pDVar10,0,pcVar2,(ulong)pSVar6);
        break;
      default:
        if (iVar8 == 0x54) {
          local_1e8.minTemplateCount =
               atoi((char *)local_138.m_Symbols.
                            super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                            super__Vector_impl_data._M_start);
        }
        else {
          if (iVar8 != 0x74) goto switchD_0010990e_caseD_62;
          dVar13 = atof((char *)local_138.m_Symbols.
                                super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                                super__Vector_impl_data._M_start);
          local_1e8.minTemplate = (int)(dVar13 * 1024.0);
        }
      }
    }
    if (iVar8 < 0x3f) {
      pDVar10 = (DebugFilters *)local_228;
      if (iVar8 == 1) goto LAB_0010999c;
      if ((iVar8 != -1) || (local_228._8_8_ == 0)) goto switchD_0010990e_caseD_62;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      clock();
      paVar1 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,".exe","");
      if ((ulong)local_228._8_8_ < local_208._M_string_length) goto LAB_00109bc1;
      bVar7 = local_208._M_string_length == 0;
      if (bVar7) goto LAB_00109bce;
      if (local_208._M_dataplus._M_p[local_208._M_string_length - 1] !=
          *(char *)(local_228._0_8_ + (local_228._8_8_ - 1))) goto LAB_00109bc1;
      lVar9 = 0;
      goto LAB_00109c62;
    }
    if (iVar8 != 0x46) break;
    dVar13 = atof((char *)local_138.m_Symbols.
                          super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_1e8.minFile = (int)(dVar13 * 1024.0);
  } while( true );
  if (iVar8 == 0x3f) {
    main_cold_1();
  }
switchD_0010990e_caseD_62:
  print_help();
  iVar8 = 0;
  goto LAB_00109ac6;
  while (lVar5 = lVar9 + (local_208._M_string_length - 2), lVar4 = lVar9 + (local_228._8_8_ - 2),
        lVar9 = lVar9 + -1, local_208._M_dataplus._M_p[lVar5] == *(char *)(local_228._0_8_ + lVar4))
  {
LAB_00109c62:
    bVar7 = 1 - local_208._M_string_length == lVar9;
    if (bVar7) goto LAB_00109bce;
  }
LAB_00109bc1:
  bVar7 = false;
LAB_00109bce:
  bVar12 = true;
  if (bVar7) {
LAB_00109bd6:
    bVar3 = false;
    bVar11 = false;
  }
  else {
    local_190 = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,".dll","");
    if (local_188 <= (ulong)local_228._8_8_) {
      bVar11 = local_188 == 0;
      if (bVar11) {
LAB_00109c27:
        if (bVar11) goto LAB_00109bd6;
      }
      else if (*(char *)((long)local_190 + (local_188 - 1)) ==
               *(char *)(local_228._0_8_ + (local_228._8_8_ - 1))) {
        lVar9 = 0;
        do {
          bVar11 = 1 - local_188 == lVar9;
          if (bVar11) goto LAB_00109c27;
          lVar5 = lVar9 + (local_188 - 2);
          lVar4 = lVar9 + (local_228._8_8_ - 2);
          lVar9 = lVar9 + -1;
        } while (*(char *)((long)local_190 + lVar5) == *(char *)(local_228._0_8_ + lVar4));
      }
    }
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,".EXE","");
    if (local_1a8 <= (ulong)local_228._8_8_) {
      bVar12 = local_1a8 == 0;
      if (bVar12) {
LAB_00109d12:
        if (bVar12) {
          bVar3 = true;
          bVar11 = false;
          bVar12 = true;
          goto LAB_00109dbb;
        }
      }
      else if (*(char *)((long)local_1b0 + (local_1a8 - 1)) ==
               *(char *)(local_228._0_8_ + (local_228._8_8_ - 1))) {
        lVar9 = 0;
        do {
          bVar12 = 1 - local_1a8 == lVar9;
          if (bVar12) goto LAB_00109d12;
          lVar5 = lVar9 + (local_1a8 - 2);
          lVar4 = lVar9 + (local_228._8_8_ - 2);
          lVar9 = lVar9 + -1;
        } while (*(char *)((long)local_1b0 + lVar5) == *(char *)(local_228._0_8_ + lVar4));
      }
    }
    local_158 = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,".DLL","");
    bVar3 = true;
    if ((ulong)local_228._8_8_ < local_150) {
LAB_00109da7:
      bVar12 = false;
    }
    else {
      bVar12 = local_150 == 0;
      if (!bVar12) {
        if (*(char *)((long)local_158 + (local_150 - 1)) ==
            *(char *)(local_228._0_8_ + (local_228._8_8_ - 1))) {
          lVar9 = 0;
          do {
            bVar12 = 1 - local_150 == lVar9;
            if (bVar12) goto LAB_00109db9;
            lVar5 = lVar9 + (local_150 - 2);
            lVar4 = lVar9 + (local_228._8_8_ - 2);
            lVar9 = lVar9 + -1;
          } while (*(char *)((long)local_158 + lVar5) == *(char *)(local_228._0_8_ + lVar4));
        }
        goto LAB_00109da7;
      }
    }
LAB_00109db9:
    bVar11 = true;
  }
LAB_00109dbb:
  if ((bVar11) && (local_158 != local_148)) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if ((bVar3) && (local_1b0 != local_1a0)) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if ((!bVar7) && (local_190 != local_180)) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (bVar12) {
    fprintf(_stderr,"Finding debug location for %s ...\n",local_228._0_8_);
    MemoryMappedFile::MemoryMappedFile(&local_170,(char *)local_228._0_8_);
    if (local_170.baseAddress == (void *)0x0) {
      main_cold_2();
      iVar8 = 1;
    }
    else {
      PEGetPDBPath_abi_cxx11_(&local_208,local_170.baseAddress,local_170.fileSize);
      if (local_208._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)local_228);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      iVar8 = 0;
    }
    MemoryMappedFile::~MemoryMappedFile(&local_170);
    if (local_170.baseAddress != (void *)0x0) goto LAB_00109ee3;
  }
  else {
LAB_00109ee3:
    fprintf(_stderr,"Reading debug info for %s ...\n",local_228._0_8_);
    bVar7 = ReadDebugInfo((char *)local_228._0_8_,&local_138);
    if (bVar7) {
      fwrite("\nProcessing info...\n",0x14,1,_stderr);
      DebugInfo::ComputeDerivedData(&local_138);
      fwrite("Generating report...\n",0x15,1,_stderr);
      DebugInfo::WriteReport_abi_cxx11_(&local_208,&local_138,&local_1e8);
      main_cold_4();
      iVar8 = 0;
    }
    else {
      main_cold_3();
      iVar8 = 1;
    }
  }
  std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::~vector(&local_138.m_Templates);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_138.m_ObjectNameToFolders._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_138.m_ObjectPathToIndex._M_t);
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector(&local_138.m_ObjectFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_138.m_NamespaceToIndex._M_t);
  std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector(&local_138.m_Namespaces);
  if (local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.m_Contribs.
                    super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.m_Contribs.
                          super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.m_Contribs.
                          super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::~vector(&local_138.m_Symbols);
LAB_00109ac6:
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
    operator_delete(local_1e8.name._M_dataplus._M_p,
                    CONCAT71(local_1e8.name.field_2._M_allocated_capacity._1_7_,
                             local_1e8.name.field_2._M_local_buf[0]) + 1);
  }
  return iVar8;
}

Assistant:

int main(int argc, char * const * argv)
{
    DebugFilters filters;
    std::string file;
    if (!parse_cmdline(argc, argv, filters, file))
    {
        return 0;
    }

    DebugInfo info;

    clock_t time1 = clock();

    if (ends_with(file, ".exe") || ends_with(file, ".dll") || ends_with(file, ".EXE") || ends_with(file, ".DLL"))
    {
        fprintf(stderr, "Finding debug location for %s ...\n", file.c_str());
        MemoryMappedFile exeFile(file.c_str());
        if (exeFile.baseAddress == nullptr)
        {
            fprintf(stderr, "ERROR: failed to memory-map file '%s'\n", file.c_str());
            return 1;
        }
        std::string pdbPath = PEGetPDBPath(exeFile.baseAddress, exeFile.fileSize);
        if (!pdbPath.empty())
            file = pdbPath;
    }

    fprintf(stderr, "Reading debug info for %s ...\n", file.c_str());
    bool pdbok = ReadDebugInfo(file.c_str(), info);
    if (!pdbok)
    {
        fprintf(stderr, "ERROR reading file via PDB\n");
        return 1;
    }
    fprintf(stderr, "\nProcessing info...\n");
    info.ComputeDerivedData();

    fprintf(stderr, "Generating report...\n");
    std::string report = info.WriteReport(filters);

    clock_t time2 = clock();
    float secs = float(time2 - time1) / CLOCKS_PER_SEC;

    fprintf(stderr, "Printing...\n");
    puts(report.c_str());
    fprintf(stderr, "Done in %.2f seconds!\n", secs);


    return 0;
}